

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::PrintValue<pstore::chunked_sequence<int,2ul,4ul,4ul>,void>
               (chunked_sequence<int,_2UL,_4UL,_4UL> *container,ostream *os)

{
  reference value;
  long lVar1;
  list_iterator lVar2;
  _List_node_base *p_Var3;
  const_iterator cVar4;
  iterator_base<true> iVar5;
  const_iterator __begin0;
  
  std::operator<<(os,'{');
  cVar4 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::begin(container);
  __begin0 = cVar4;
  iVar5 = pstore::chunked_sequence<int,2ul,4ul,4ul>::
          end_impl<pstore::chunked_sequence<int,2ul,4ul,4ul>const,pstore::chunked_sequence<int,2ul,4ul,4ul>::iterator_base<true>>
                    (container);
  lVar1 = 0;
  do {
    if (iVar5 == cVar4) {
      if (lVar1 != 0) {
LAB_00141c37:
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    value = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<true>::operator*(&__begin0);
    if ((lVar1 != 0) && (std::operator<<(os,','), lVar1 == 0x20)) {
      std::operator<<(os," ...");
      goto LAB_00141c37;
    }
    std::operator<<(os,' ');
    internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
    PrintValue<int,void,std::ostream&>(value,os);
    p_Var3 = (_List_node_base *)(__begin0.index_ + 1);
    __begin0.index_ = (size_t)p_Var3;
    lVar2._M_node = __begin0.chunk_it_._M_node;
    if (__begin0.chunk_it_._M_node[1]._M_next <= p_Var3) {
      lVar2._M_node = (__begin0.chunk_it_._M_node)->_M_next;
      __begin0.index_ = 0;
      __begin0.chunk_it_._M_node = lVar2._M_node;
      p_Var3 = (_List_node_base *)0x0;
    }
    cVar4.index_ = (size_t)p_Var3;
    cVar4.chunk_it_._M_node = lVar2._M_node;
    lVar1 = lVar1 + 1;
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }